

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O0

uint32_t ExUtilGetUInt(char *v,int base,int *error)

{
  ulong uVar1;
  int *in_RDX;
  int in_ESI;
  char *in_RDI;
  uint32_t n;
  char *end;
  char *local_38;
  uint32_t local_28;
  char *local_20;
  int *local_18;
  char *local_8;
  
  local_20 = (char *)0x0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (in_RDI == (char *)0x0) {
    local_28 = 0;
  }
  else {
    uVar1 = strtoul(in_RDI,&local_20,in_ESI);
    local_28 = (uint32_t)uVar1;
  }
  if (((local_20 == local_8) && (local_18 != (int *)0x0)) && (*local_18 == 0)) {
    *local_18 = 1;
    if (local_8 == (char *)0x0) {
      local_38 = "(null)";
    }
    else {
      local_38 = local_8;
    }
    fprintf(stderr,"Error! \'%s\' is not an integer.\n",local_38);
  }
  return local_28;
}

Assistant:

uint32_t ExUtilGetUInt(const char* const v, int base, int* const error) {
  char* end = NULL;
  const uint32_t n = (v != NULL) ? (uint32_t)strtoul(v, &end, base) : 0u;
  if (end == v && error != NULL && !*error) {
    *error = 1;
    fprintf(stderr, "Error! '%s' is not an integer.\n",
            (v != NULL) ? v : "(null)");
  }
  return n;
}